

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterCompareText
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  byte bVar1;
  byte bVar2;
  KeyInfo *pKVar3;
  int iVar4;
  int iVar5;
  int n1;
  int local_44;
  int local_40;
  int n2;
  int *local_38;
  
  bVar1 = *pKey1;
  bVar2 = *pKey2;
  n1 = (int)*(byte *)((long)pKey1 + 1);
  local_44 = nKey1;
  local_40 = nKey2;
  local_38 = pbKey2Cached;
  if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
    sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&n1);
  }
  n2 = (int)*(byte *)((long)pKey2 + 1);
  if ((char)*(byte *)((long)pKey2 + 1) < '\0') {
    sqlite3GetVarint32((uchar *)((long)pKey2 + 1),(u32 *)&n2);
  }
  iVar5 = n1 - n2;
  iVar4 = n2;
  if (n1 < n2) {
    iVar4 = n1;
  }
  iVar4 = memcmp((void *)((ulong)bVar1 + (long)pKey1),(void *)((ulong)bVar2 + (long)pKey2),
                 (long)((iVar4 + -0xd) / 2));
  if (iVar4 != 0) {
    iVar5 = iVar4;
  }
  pKVar3 = pTask->pSorter->pKeyInfo;
  if (iVar5 == 0) {
    iVar4 = 0;
    if (1 < pKVar3->nKeyField) {
      iVar4 = vdbeSorterCompareTail(pTask,local_38,pKey1,local_44,pKey2,local_40);
      return iVar4;
    }
  }
  else {
    iVar4 = -iVar5;
    if (*pKVar3->aSortFlags == '\0') {
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

static int vdbeSorterCompareText(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */

  int n1;
  int n2;
  int res;

  getVarint32NR(&p1[1], n1);
  getVarint32NR(&p2[1], n2);
  res = memcmp(v1, v2, (MIN(n1, n2) - 13)/2);
  if( res==0 ){
    res = n1 - n2;
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nKeyField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else{
    assert( !(pTask->pSorter->pKeyInfo->aSortFlags[0]&KEYINFO_ORDER_BIGNULL) );
    if( pTask->pSorter->pKeyInfo->aSortFlags[0] ){
      res = res * -1;
    }
  }

  return res;
}